

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O2

void __thiscall r_exec::ICST::~ICST(ICST *this)

{
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__ICST_001d0fe8;
  std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::~vector
            (&this->components);
  core::P<r_exec::BindingMap>::~P(&this->bindings);
  Object<r_code::LObject,_r_exec::LObject>::~Object
            ((Object<r_code::LObject,_r_exec::LObject> *)this);
  return;
}

Assistant:

class REPLICODE_EXPORT ICST:
    public LObject
{
public:
    ICST();
    ICST(r_code::SysObject *source);

    bool is_invalidated();

    bool contains(_Fact *component, uint16_t &component_index) const;

    P<BindingMap> bindings;
    std::vector<P<_Fact> > components; // the inputs that triggered the building of the icst.
}